

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_IHDR(ucvector *out,uint w,uint h,LodePNGColorType colortype,uint bitdepth,
                  uint interlace_method)

{
  uint uVar1;
  undefined4 in_ECX;
  uint in_EDX;
  uint in_ESI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  uchar data [13];
  size_t in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  
  lodepng_set32bitInt(&stack0xffffffffffffffd7,in_ESI);
  lodepng_set32bitInt(&stack0xffffffffffffffdb,in_EDX);
  uVar1 = addChunk((ucvector *)CONCAT44(in_ECX,in_R8D),
                   (char *)CONCAT44(in_R9D,CONCAT13((char)in_R9D,(uint3)(byte)in_ECX)),
                   (uchar *)CONCAT17((char)in_R8D,in_stack_ffffffffffffffd8),
                   in_stack_ffffffffffffffd0);
  return uVar1;
}

Assistant:

static unsigned addChunk_IHDR(ucvector* out, unsigned w, unsigned h,
                              LodePNGColorType colortype, unsigned bitdepth, unsigned interlace_method) {
  unsigned char data[13];

  lodepng_set32bitInt(data + 0, w); /*width*/
  lodepng_set32bitInt(data + 4, h); /*height*/
  data[8] = (unsigned char)bitdepth; /*bit depth*/
  data[9] = (unsigned char)colortype; /*color type*/
  data[10] = 0; /*compression method*/
  data[11] = 0; /*filter method*/
  data[12] = interlace_method; /*interlace method*/

  return addChunk(out, "IHDR", data, sizeof(data));
}